

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

IfcVector3 *
Assimp::IFC::TempMesh::ComputePolygonNormal
          (IfcVector3 *__return_storage_ptr__,IfcVector3 *vtcs,size_t cnt,bool normalize)

{
  value_type vVar1;
  double *pdVar2;
  reference pvVar3;
  reference y;
  reference z;
  aiVector3t<double> *local_f0;
  undefined1 local_80 [8];
  IfcVector3 nor;
  IfcVector3 *v;
  size_t i;
  size_t vofs;
  allocator<double> local_39;
  undefined1 local_38 [8];
  vector<double,_std::allocator<double>_> temp;
  int iStack_18;
  bool normalize_local;
  size_t cnt_local;
  IfcVector3 *vtcs_local;
  
  temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = normalize;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_38,cnt * 3 + 6,&local_39);
  std::allocator<double>::~allocator(&local_39);
  v = (IfcVector3 *)0x0;
  for (i = 0; i < cnt; i = i + 1) {
    nor.z = (double)(vtcs + i);
    vVar1 = ((IfcVector3 *)nor.z)->x;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,(size_type)v);
    *pvVar3 = vVar1;
    vVar1 = *(value_type *)((long)nor.z + 8);
    pdVar2 = &v->x;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,
                        (size_type)((long)&v->x + 1));
    *pvVar3 = vVar1;
    vVar1 = *(value_type *)((long)nor.z + 0x10);
    v = (IfcVector3 *)((long)&v->x + 3);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,
                        (size_type)((long)pdVar2 + 2));
    *pvVar3 = vVar1;
  }
  aiVector3t<double>::aiVector3t((aiVector3t<double> *)local_80);
  iStack_18 = (int)cnt;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_38,0);
  y = std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)local_38,1);
  z = std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)local_38,2);
  NewellNormal<3,3,3,double>((aiVector3t<double> *)local_80,iStack_18,pvVar3,y,z);
  if ((temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._7_1_ & 1) == 0) {
    local_f0 = (aiVector3t<double> *)local_80;
  }
  else {
    local_f0 = aiVector3t<double>::Normalize((aiVector3t<double> *)local_80);
  }
  __return_storage_ptr__->x = local_f0->x;
  __return_storage_ptr__->y = local_f0->y;
  __return_storage_ptr__->z = local_f0->z;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

IfcVector3 TempMesh::ComputePolygonNormal(const IfcVector3* vtcs, size_t cnt, bool normalize)
{
    std::vector<IfcFloat> temp((cnt+2)*3);
    for( size_t vofs = 0, i = 0; vofs < cnt; ++vofs )
    {
        const IfcVector3& v = vtcs[vofs];
        temp[i++] = v.x;
        temp[i++] = v.y;
        temp[i++] = v.z;
    }

    IfcVector3 nor;
    NewellNormal<3, 3, 3>(nor, static_cast<int>(cnt), &temp[0], &temp[1], &temp[2]);
    return normalize ? nor.Normalize() : nor;
}